

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

bool CheckPeerVerifyPrefs(SSL *ssl)

{
  pointer puVar1;
  TestConfig *pTVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  uint16_t *peer_sigalgs;
  uint16_t *local_20;
  
  pTVar2 = GetTestConfig(ssl);
  bVar5 = true;
  if ((pTVar2->expect_peer_verify_prefs).
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pTVar2->expect_peer_verify_prefs).
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    sVar3 = SSL_get0_peer_verify_algorithms(ssl,&local_20);
    puVar1 = (pTVar2->expect_peer_verify_prefs).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(pTVar2->expect_peer_verify_prefs).
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar1 >> 1 == sVar3) {
      for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
        if (local_20[sVar4] != puVar1[sVar4]) {
          fprintf(_stderr,"peer verify preference %zu mismatch (got %04x, wanted %04x\n");
          return false;
        }
      }
    }
    else {
      bVar5 = false;
      fprintf(_stderr,"peer verify preferences length mismatch (got %zu, wanted %zu)\n",sVar3);
    }
  }
  return bVar5;
}

Assistant:

static bool CheckPeerVerifyPrefs(SSL *ssl) {
  const TestConfig *config = GetTestConfig(ssl);
  if (!config->expect_peer_verify_prefs.empty()) {
    const uint16_t *peer_sigalgs;
    size_t num_peer_sigalgs =
        SSL_get0_peer_verify_algorithms(ssl, &peer_sigalgs);
    if (config->expect_peer_verify_prefs.size() != num_peer_sigalgs) {
      fprintf(stderr,
              "peer verify preferences length mismatch (got %zu, wanted %zu)\n",
              num_peer_sigalgs, config->expect_peer_verify_prefs.size());
      return false;
    }
    for (size_t i = 0; i < num_peer_sigalgs; i++) {
      if (peer_sigalgs[i] != config->expect_peer_verify_prefs[i]) {
        fprintf(stderr,
                "peer verify preference %zu mismatch (got %04x, wanted %04x\n",
                i, peer_sigalgs[i], config->expect_peer_verify_prefs[i]);
        return false;
      }
    }
  }
  return true;
}